

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

lua_Number lua_tonumber(lua_State *L,int idx)

{
  TValue *n_00;
  int in_ESI;
  lua_State *in_RDI;
  TValue *o;
  TValue n;
  TValue *in_stack_ffffffffffffffd8;
  
  n_00 = index2adr(in_RDI,in_ESI);
  if ((n_00->tt != 3) &&
     (n_00 = luaV_tonumber(in_stack_ffffffffffffffd8,n_00), n_00 == (TValue *)0x0)) {
    return 0.0;
  }
  return (lua_Number)(n_00->value).gc;
}

Assistant:

static lua_Number lua_tonumber(lua_State*L,int idx){
TValue n;
const TValue*o=index2adr(L,idx);
if(tonumber(o,&n))
return nvalue(o);
else
return 0;
}